

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

void __thiscall
tchecker::typed_local_var_statement_t::typed_local_var_statement_t
          (typed_local_var_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_var_expression_t> *variable)

{
  shared_ptr<const_tchecker::var_expression_t> local_30;
  shared_ptr<const_tchecker::typed_var_expression_t> *local_20;
  shared_ptr<const_tchecker::typed_var_expression_t> *variable_local;
  typed_local_var_statement_t *ptStack_10;
  statement_type_t type_local;
  typed_local_var_statement_t *this_local;
  
  local_20 = variable;
  variable_local._4_4_ = type;
  ptStack_10 = this;
  statement_t::statement_t((statement_t *)this);
  typed_statement_t::typed_statement_t
            (&this->super_typed_statement_t,&PTR_PTR_004852c0,variable_local._4_4_);
  std::shared_ptr<tchecker::var_expression_t_const>::
  shared_ptr<tchecker::typed_var_expression_t_const,void>
            ((shared_ptr<tchecker::var_expression_t_const> *)&local_30,local_20);
  local_var_statement_t::local_var_statement_t
            (&this->super_local_var_statement_t,&PTR_construction_vtable_56__004852d0,&local_30);
  std::shared_ptr<const_tchecker::var_expression_t>::~shared_ptr(&local_30);
  *(undefined8 *)&this->super_typed_statement_t = 0x485218;
  *(undefined8 *)&this->super_typed_statement_t = 0x485218;
  *(undefined8 *)&this->super_local_var_statement_t = 0x485288;
  return;
}

Assistant:

typed_local_var_statement_t::typed_local_var_statement_t(
    enum tchecker::statement_type_t type, std::shared_ptr<tchecker::typed_var_expression_t const> const & variable)
    : tchecker::typed_statement_t(type), tchecker::local_var_statement_t(variable)
{
}